

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsMuxer.cpp
# Opt level: O0

void __thiscall TSMuxer::processM2TSPCR(TSMuxer *this,int64_t pcrVal,int64_t pcrGAP)

{
  uint8_t *puVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  reference ppVar5;
  longlong lVar6;
  double dVar7;
  uint8_t *end;
  int j;
  pair<unsigned_char_*,_int> *i;
  iterator __end2;
  iterator __begin2;
  vector<std::pair<unsigned_char_*,_int>,_std::allocator<std::pair<unsigned_char_*,_int>_>_>
  *__range2;
  uchar *puStack_50;
  int offset;
  uint8_t *curPos;
  double curM2TSPCR;
  double pcrIncPerFrame;
  int64_t pcrValDif;
  int64_t hiResPCR;
  int m2tsFrameCnt;
  int64_t pcrGAP_local;
  int64_t pcrVal_local;
  TSMuxer *this_local;
  
  iVar3 = calcM2tsFrameCnt(this);
  lVar4 = pcrVal * 300 - pcrGAP;
  dVar7 = (double)(lVar4 - this->m_prevM2TSPCR) / (double)iVar3;
  curPos = (uint8_t *)(double)this->m_prevM2TSPCR;
  bVar2 = std::
          vector<std::pair<unsigned_char_*,_int>,_std::allocator<std::pair<unsigned_char_*,_int>_>_>
          ::empty(&this->m_m2tsDelayBlocks);
  if (!bVar2) {
    __range2._4_4_ = this->m_prevM2TSPCROffset;
    __end2 = std::
             vector<std::pair<unsigned_char_*,_int>,_std::allocator<std::pair<unsigned_char_*,_int>_>_>
             ::begin(&this->m_m2tsDelayBlocks);
    i = (pair<unsigned_char_*,_int> *)
        std::
        vector<std::pair<unsigned_char_*,_int>,_std::allocator<std::pair<unsigned_char_*,_int>_>_>::
        end(&this->m_m2tsDelayBlocks);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::pair<unsigned_char_*,_int>_*,_std::vector<std::pair<unsigned_char_*,_int>,_std::allocator<std::pair<unsigned_char_*,_int>_>_>_>
                                       *)&i), bVar2) {
      ppVar5 = __gnu_cxx::
               __normal_iterator<std::pair<unsigned_char_*,_int>_*,_std::vector<std::pair<unsigned_char_*,_int>,_std::allocator<std::pair<unsigned_char_*,_int>_>_>_>
               ::operator*(&__end2);
      puStack_50 = ppVar5->first + __range2._4_4_;
      for (end._4_4_ = __range2._4_4_; end._4_4_ < ppVar5->second; end._4_4_ = end._4_4_ + 0xc0) {
        curPos = (uint8_t *)(dVar7 + (double)curPos);
        lVar6 = llround((double)curPos);
        writeM2TSHeader(puStack_50,lVar6);
        puStack_50 = puStack_50 + 0xc0;
      }
      bVar2 = MuxerManager::isAsyncMode((this->super_AbstractMuxer).m_owner);
      if (bVar2) {
        MuxerManager::asyncWriteBuffer
                  ((this->super_AbstractMuxer).m_owner,&this->super_AbstractMuxer,ppVar5->first,
                   ppVar5->second,this->m_muxFile);
      }
      else {
        MuxerManager::syncWriteBuffer
                  ((this->super_AbstractMuxer).m_owner,&this->super_AbstractMuxer,ppVar5->first,
                   ppVar5->second,this->m_muxFile);
        if (ppVar5->first != (uchar *)0x0) {
          operator_delete__(ppVar5->first);
        }
      }
      __range2._4_4_ = end._4_4_ - ppVar5->second;
      __gnu_cxx::
      __normal_iterator<std::pair<unsigned_char_*,_int>_*,_std::vector<std::pair<unsigned_char_*,_int>,_std::allocator<std::pair<unsigned_char_*,_int>_>_>_>
      ::operator++(&__end2);
    }
    this->m_prevM2TSPCROffset = __range2._4_4_;
    std::vector<std::pair<unsigned_char_*,_int>,_std::allocator<std::pair<unsigned_char_*,_int>_>_>
    ::clear(&this->m_m2tsDelayBlocks);
  }
  puVar1 = this->m_outBuf;
  iVar3 = this->m_outBufLen;
  for (puStack_50 = this->m_outBuf + this->m_prevM2TSPCROffset; puStack_50 < puVar1 + iVar3;
      puStack_50 = puStack_50 + 0xc0) {
    curPos = (uint8_t *)(dVar7 + (double)curPos);
    lVar6 = llround((double)curPos);
    writeM2TSHeader(puStack_50,lVar6);
  }
  if (puStack_50 != puVar1 + iVar3) {
    __assert_fail("curPos == end",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jcdr428[P]tsMuxer/tsMuxer/tsMuxer.cpp"
                  ,0x21e,"void TSMuxer::processM2TSPCR(const int64_t, const int64_t)");
  }
  this->m_prevM2TSPCROffset = this->m_outBufLen;
  this->m_prevM2TSPCR = lVar4;
  return;
}

Assistant:

void TSMuxer::processM2TSPCR(const int64_t pcrVal, const int64_t pcrGAP)
{
    const int m2tsFrameCnt = calcM2tsFrameCnt();
    const int64_t hiResPCR = pcrVal * 300 - pcrGAP;
    const int64_t pcrValDif = hiResPCR - m_prevM2TSPCR;  // m2ts pcr clock based on full 27Mhz counter
    const double pcrIncPerFrame = static_cast<double>(pcrValDif) / m2tsFrameCnt;

    auto curM2TSPCR = static_cast<double>(m_prevM2TSPCR);
    uint8_t* curPos;
    if (!m_m2tsDelayBlocks.empty())
    {
        int offset = m_prevM2TSPCROffset;
        for (const auto& i : m_m2tsDelayBlocks)
        {
            curPos = i.first + offset;
            int j = offset;
            for (; j < i.second; j += 192)
            {
                curM2TSPCR += pcrIncPerFrame;
                writeM2TSHeader(curPos, llround(curM2TSPCR));
                curPos += 192;
            }
            if (m_owner->isAsyncMode())
                m_owner->asyncWriteBuffer(this, i.first, i.second, m_muxFile);
            else
            {
                m_owner->syncWriteBuffer(this, i.first, i.second, m_muxFile);
                delete[] i.first;
            }
            offset = j - i.second;
        }
        m_prevM2TSPCROffset = offset;
        m_m2tsDelayBlocks.clear();
    }
    curPos = m_outBuf + m_prevM2TSPCROffset;
    const uint8_t* end = m_outBuf + m_outBufLen;
    for (; curPos < end; curPos += 192)
    {
        curM2TSPCR += pcrIncPerFrame;
        writeM2TSHeader(curPos, llround(curM2TSPCR));
    }
    assert(curPos == end);
    m_prevM2TSPCROffset = m_outBufLen;
    // assert((int64_t) curM2TSPCR == hiResPCR);
    m_prevM2TSPCR = hiResPCR;
}